

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.h
# Opt level: O1

void xLearn::AUCMetric::auc_accum_thread
               (vector<float,_std::allocator<float>_> *Y,vector<float,_std::allocator<float>_> *pred
               ,Info *info,size_t start_idx,size_t end_idx)

{
  pointer puVar1;
  pointer pfVar2;
  pointer pfVar3;
  float fVar4;
  undefined8 uVar5;
  ostream *poVar6;
  size_t i;
  float fVar7;
  int iVar8;
  Info *pIVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  Logger local_6c;
  string local_68;
  string local_48;
  
  if (start_idx <= end_idx) {
    if (start_idx < end_idx) {
      pfVar2 = (Y->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pfVar3 = (pred->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      do {
        auVar10 = ZEXT416((uint)(pfVar3[start_idx] * -1.442695));
        uVar5 = vcmpss_avx512f(auVar10,ZEXT816(0) << 0x40,1);
        auVar10 = vmaxss_avx(SUB6416(ZEXT464(0xc2fc0000),0),auVar10);
        fVar4 = auVar10._0_4_;
        auVar11._0_4_ = (int)fVar4;
        auVar11._4_4_ = (int)auVar10._4_4_;
        auVar11._8_4_ = (int)auVar10._8_4_;
        auVar11._12_4_ = (int)auVar10._12_4_;
        auVar10 = vcvtdq2ps_avx(auVar11);
        fVar7 = (float)((uint)((byte)uVar5 & 1) * 0x3f800000) + (fVar4 - auVar10._0_4_);
        auVar10 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 + 121.274055 +
                                                27.728024 / (4.8425255 - fVar7))),
                                  ZEXT416((uint)fVar7),SUB6416(ZEXT464(0xbfbebc8d),0));
        fVar7 = (float)vcvttss2usi_avx512f(ZEXT416((uint)(auVar10._0_4_ * 8388608.0)));
        iVar8 = vcvttss2usi_avx512f(ZEXT416((uint)((1.0 / (fVar7 + 1.0)) * 1e+06)));
        Y = (vector<float,_std::allocator<float>_> *)
            (ulong)(iVar8 + (uint)((ulong)(CONCAT44((int)((ulong)Y >> 0x20),iVar8) * 0x431bde83) >>
                                  0x32) * -1000000);
        pIVar9 = (Info *)&info->negative_vec_;
        if (0.0 < pfVar2[start_idx]) {
          pIVar9 = info;
        }
        puVar1 = (pIVar9->positive_vec_).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start + (long)Y;
        *puVar1 = *puVar1 + 1;
        start_idx = start_idx + 1;
      } while (end_idx != start_idx);
    }
    return;
  }
  local_6c.severity_ = ERR;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,
             "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/loss/metric.h"
             ,"");
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"auc_accum_thread","");
  poVar6 = Logger::Start(ERR,&local_48,499,&local_68);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"CHECK_GE failed ",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,
             "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/loss/metric.h"
             ,0x5b);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,":",1);
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,499);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"end_idx",7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," = ",3);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"start_idx",9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," = ",3);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  std::operator<<(poVar6,"\n");
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  Logger::~Logger(&local_6c);
  abort();
}

Assistant:

static void auc_accum_thread(const std::vector<real_t>* Y,
                               const std::vector<real_t>* pred,
                               Info* info,
                               size_t start_idx,
                               size_t end_idx) {
    CHECK_GE(end_idx, start_idx);
    for (size_t i = start_idx; i < end_idx; ++i) {
      real_t r_label = (*Y)[i] > 0 ? 1 : -1;
      real_t sigmoid_score = fastsigmoid((*pred)[i]);
      index_t bkt_id = index_t(sigmoid_score * kMaxBucketSize) 
                       % kMaxBucketSize;
      CHECK_LT(bkt_id, kMaxBucketSize);
      if (r_label > 0) {
        info->positive_vec_[bkt_id] += 1;
      } else {
        info->negative_vec_[bkt_id] += 1;
      }
    }
  }